

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::ExceptionBreakpointsFilter>::construct
          (BasicTypeInfo<dap::ExceptionBreakpointsFilter> *this,void *ptr)

{
  memset(ptr,0,0xa0);
  *(long *)ptr = (long)ptr + 0x10;
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined1 *)((long)ptr + 0x10) = 0;
  *(undefined1 *)((long)ptr + 0x20) = 0;
  *(undefined2 *)((long)ptr + 0x28) = 0;
  *(long *)((long)ptr + 0x30) = (long)ptr + 0x40;
  *(undefined8 *)((long)ptr + 0x38) = 0;
  *(undefined1 *)((long)ptr + 0x40) = 0;
  *(undefined1 *)((long)ptr + 0x50) = 0;
  *(long *)((long)ptr + 0x58) = (long)ptr + 0x68;
  *(undefined8 *)((long)ptr + 0x60) = 0;
  *(undefined1 *)((long)ptr + 0x68) = 0;
  *(long *)((long)ptr + 0x78) = (long)ptr + 0x88;
  *(undefined8 *)((long)ptr + 0x80) = 0;
  *(undefined1 *)((long)ptr + 0x88) = 0;
  *(undefined2 *)((long)ptr + 0x98) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }